

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyBalance.c
# Opt level: O1

Ivy_Man_t * Ivy_ManBalance(Ivy_Man_t *p,int fUpdateLevel)

{
  void *pvVar1;
  uint uVar2;
  int iVar3;
  Ivy_Man_t *p_00;
  Ivy_Obj_t *pIVar4;
  Vec_Vec_t *vStore;
  void **ppvVar5;
  Vec_Ptr_t *pVVar6;
  uint uVar7;
  long lVar8;
  
  Ivy_ManCleanTravId(p);
  p_00 = Ivy_ManStart();
  p->pConst1->TravId =
       ((uint)p_00->pConst1 & 1) + *(int *)((ulong)p_00->pConst1 & 0xfffffffffffffffe) * 2;
  pVVar6 = p->vPis;
  if (0 < pVVar6->nSize) {
    lVar8 = 0;
    do {
      pvVar1 = pVVar6->pArray[lVar8];
      pIVar4 = Ivy_ObjCreatePi(p_00);
      *(uint *)((long)pvVar1 + 4) =
           ((uint)pIVar4 & 1) + *(int *)((ulong)pIVar4 & 0xfffffffffffffffe) * 2;
      lVar8 = lVar8 + 1;
      pVVar6 = p->vPis;
    } while (lVar8 < pVVar6->nSize);
  }
  vStore = (Vec_Vec_t *)malloc(0x10);
  vStore->nCap = 0x32;
  vStore->nSize = 0;
  ppvVar5 = (void **)malloc(400);
  vStore->pArray = ppvVar5;
  pVVar6 = p->vPos;
  if (0 < pVVar6->nSize) {
    lVar8 = 0;
    do {
      pIVar4 = Ivy_ObjReal(*(Ivy_Obj_t **)((long)pVVar6->pArray[lVar8] + 0x10));
      uVar2 = Ivy_NodeBalance_rec(p_00,(Ivy_Obj_t *)((ulong)pIVar4 & 0xfffffffffffffffe),vStore,0,
                                  fUpdateLevel);
      uVar7 = (int)uVar2 >> 1;
      if (((int)uVar7 < 0) || (p_00->vObjs->nSize <= (int)uVar7)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      Ivy_ObjCreatePo(p_00,(Ivy_Obj_t *)
                           ((ulong)((uVar2 ^ (uint)pIVar4) & 1) ^ (ulong)p_00->vObjs->pArray[uVar7])
                     );
      lVar8 = lVar8 + 1;
      pVVar6 = p->vPos;
    } while (lVar8 < pVVar6->nSize);
  }
  iVar3 = vStore->nSize;
  if (0 < (long)iVar3) {
    ppvVar5 = vStore->pArray;
    lVar8 = 0;
    do {
      pvVar1 = ppvVar5[lVar8];
      if (pvVar1 != (void *)0x0) {
        if (*(void **)((long)pvVar1 + 8) != (void *)0x0) {
          free(*(void **)((long)pvVar1 + 8));
          *(undefined8 *)((long)pvVar1 + 8) = 0;
        }
        free(pvVar1);
      }
      lVar8 = lVar8 + 1;
    } while (iVar3 != lVar8);
  }
  if (vStore->pArray != (void **)0x0) {
    free(vStore->pArray);
    vStore->pArray = (void **)0x0;
  }
  free(vStore);
  Ivy_ManCleanup(p_00);
  iVar3 = Ivy_ManCheck(p_00);
  if (iVar3 == 0) {
    puts("Ivy_ManBalance(): The check has failed.");
  }
  return p_00;
}

Assistant:

Ivy_Man_t * Ivy_ManBalance( Ivy_Man_t * p, int fUpdateLevel )
{
    Ivy_Man_t * pNew;
    Ivy_Obj_t * pObj, * pDriver;
    Vec_Vec_t * vStore;
    int i, NewNodeId;
    // clean the old manager
    Ivy_ManCleanTravId( p );
    // create the new manager 
    pNew = Ivy_ManStart();
    // map the nodes
    Ivy_ManConst1(p)->TravId = Ivy_EdgeFromNode( Ivy_ManConst1(pNew) );
    Ivy_ManForEachPi( p, pObj, i )
        pObj->TravId = Ivy_EdgeFromNode( Ivy_ObjCreatePi(pNew) );
    // if HAIG is defined, trasfer the pointers to the PIs/latches
//    if ( p->pHaig )
//        Ivy_ManHaigTrasfer( p, pNew );
    // balance the AIG
    vStore = Vec_VecAlloc( 50 );
    Ivy_ManForEachPo( p, pObj, i )
    {
        pDriver   = Ivy_ObjReal( Ivy_ObjChild0(pObj) );
        NewNodeId = Ivy_NodeBalance_rec( pNew, Ivy_Regular(pDriver), vStore, 0, fUpdateLevel );
        NewNodeId = Ivy_EdgeNotCond( NewNodeId, Ivy_IsComplement(pDriver) );
        Ivy_ObjCreatePo( pNew, Ivy_EdgeToNode(pNew, NewNodeId) );
    }
    Vec_VecFree( vStore );
    if ( (i = Ivy_ManCleanup( pNew )) )
    {
//        printf( "Cleanup after balancing removed %d dangling nodes.\n", i );
    }
    // check the resulting AIG
    if ( !Ivy_ManCheck(pNew) )
        printf( "Ivy_ManBalance(): The check has failed.\n" );
    return pNew;
}